

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ModportClockingPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportClockingPortSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2)

{
  Token clocking;
  Token name;
  ModportClockingPortSyntax *this_00;
  
  this_00 = (ModportClockingPortSyntax *)allocate(this,0x60,8);
  clocking.kind = args_1->kind;
  clocking._2_1_ = args_1->field_0x2;
  clocking.numFlags.raw = (args_1->numFlags).raw;
  clocking.rawLen = args_1->rawLen;
  clocking.info = args_1->info;
  name.kind = args_2->kind;
  name._2_1_ = args_2->field_0x2;
  name.numFlags.raw = (args_2->numFlags).raw;
  name.rawLen = args_2->rawLen;
  name.info = args_2->info;
  slang::syntax::ModportClockingPortSyntax::ModportClockingPortSyntax(this_00,args,clocking,name);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }